

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O0

void __thiscall duckdb::ARTMerger::MergeLeaves(ARTMerger *this,NodeEntry *entry)

{
  ulong uVar1;
  NType NVar2;
  NType NVar3;
  idx_t iVar4;
  uchar *puVar5;
  undefined8 *in_RSI;
  long in_RDI;
  undefined7 in_stack_00000028;
  uint8_t in_stack_0000002f;
  ARTMerger *in_stack_00000030;
  ART *in_stack_00000038;
  idx_t i;
  array_ptr<unsigned_char,_true> bytes;
  idx_t in_stack_ffffffffffffff98;
  Node *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  uchar in_stack_ffffffffffffffb7;
  undefined1 local_30 [8];
  ulong local_28;
  array_ptr<unsigned_char,_true> local_20;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  NVar2 = Node::GetType((Node *)0x18cab55);
  NVar3 = Node::GetType((Node *)0x18cab67);
  if (NVar2 < NVar3) {
    ::std::swap<duckdb::Node>((Node *)*local_10,(Node *)local_10[1]);
  }
  local_20 = GetBytes(in_stack_00000030,(Node *)CONCAT17(in_stack_0000002f,in_stack_00000028));
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    iVar4 = array_ptr<unsigned_char,_true>::size(&local_20);
    if (iVar4 <= uVar1) break;
    in_stack_ffffffffffffffa8 = (Node *)*local_10;
    puVar5 = array_ptr<unsigned_char,_true>::operator[]
                       (*(array_ptr<unsigned_char,_true> **)(in_RDI + 0x48),
                        in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffb7 = *puVar5;
    memset(local_30,0,8);
    Node::Node((Node *)0x18cac19);
    Node::InsertChild(in_stack_00000038,(Node *)in_stack_00000030,in_stack_0000002f,(Node)i);
    local_28 = local_28 + 1;
  }
  Node::Free((ART *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void ARTMerger::MergeLeaves(NodeEntry &entry) {
	D_ASSERT(entry.left.IsLeafNode());
	D_ASSERT(entry.right.IsLeafNode());
	D_ASSERT(entry.left.GetGateStatus() == GateStatus::GATE_NOT_SET);
	D_ASSERT(entry.right.GetGateStatus() == GateStatus::GATE_NOT_SET);

	// Merge the smaller leaf into the bigger leaf.
	if (entry.left.GetType() < entry.right.GetType()) {
		swap(entry.left, entry.right);
	}

	// Get the bytes of the right node.
	// Then, copy them into left.
	auto bytes = GetBytes(entry.right);

	// FIXME: Obtain a reference to left once and
	// FIXME: handle the different node type combinations.
	for (idx_t i = 0; i < bytes.size(); i++) {
		Node::InsertChild(art, entry.left, bytes[i]);
	}
	Node::Free(art, entry.right);
}